

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

bool __thiscall
cmStringCommand::RegexMatchAll
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *delimiter;
  pointer pbVar1;
  undefined4 uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  undefined7 extraout_var;
  long *plVar7;
  pointer pbVar8;
  size_type *psVar9;
  byte bVar10;
  _Alloc_hider string;
  char *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string output;
  string e_1;
  string input;
  RegularExpression re;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [36];
  undefined4 local_15c;
  string local_158;
  pointer local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  cmCommand *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  RegularExpression local_100;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
  local_100.regmatch.startp[0] = (char *)0x0;
  local_100.regmatch.endp[0] = (char *)0x0;
  local_100.regmatch.searchstring = (char *)0x0;
  local_100.program = (char *)0x0;
  bVar6 = cmsys::RegularExpression::compile(&local_100,pbVar1[2]._M_dataplus._M_p);
  __rhs = pbVar1 + 2;
  local_138 = pbVar1;
  if (bVar6) {
    local_180._8_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_180._0_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start + 4;
    delimiter = &local_1a0.field_2;
    local_1a0._M_string_length = 0;
    local_1a0.field_2._M_local_buf[0] = '\0';
    local_1a0._M_dataplus._M_p = (pointer)delimiter;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_158,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_180,delimiter->_M_local_buf);
    local_130 = __rhs;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != delimiter) {
      operator_delete(local_1a0._M_dataplus._M_p,
                      CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                               local_1a0.field_2._M_local_buf[0]) + 1);
    }
    local_138 = local_138 + 3;
    local_1a0._M_string_length = 0;
    local_1a0.field_2._M_local_buf[0] = '\0';
    pbVar1 = (pointer)(local_180 + 0x10);
    string._M_p = local_158._M_dataplus._M_p;
    local_1a0._M_dataplus._M_p = (pointer)delimiter;
    local_128 = &this->super_cmCommand;
    do {
      bVar6 = cmsys::RegularExpression::find(&local_100,string._M_p,&local_100.regmatch);
      local_15c = (undefined4)CONCAT71(extraout_var,bVar6);
      if (!bVar6) {
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,local_138,local_1a0._M_dataplus._M_p);
        break;
      }
      cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
      cmMakefile::StoreMatches((this->super_cmCommand).Makefile,&local_100);
      pcVar5 = local_100.regmatch.searchstring;
      pcVar4 = local_100.regmatch.endp[0];
      pcVar3 = local_100.regmatch.startp[0];
      if (local_100.regmatch.endp[0] == local_100.regmatch.startp[0]) {
        std::operator+(&local_120,"sub-command REGEX, mode MATCHALL regex \"",local_130);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_120);
        pbVar8 = (pointer)(plVar7 + 2);
        if ((pointer)*plVar7 == pbVar8) {
          local_180._16_8_ = (pbVar8->_M_dataplus)._M_p;
          local_180._24_8_ = plVar7[3];
          local_180._0_8_ = pbVar1;
        }
        else {
          local_180._16_8_ = (pbVar8->_M_dataplus)._M_p;
          local_180._0_8_ = (pointer)*plVar7;
        }
        local_180._8_8_ = plVar7[1];
        *plVar7 = (long)pbVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        cmCommand::SetError(&this->super_cmCommand,(string *)local_180);
      }
      else {
        if (local_1a0._M_string_length != 0) {
          std::__cxx11::string::append((char *)&local_1a0);
        }
        pcVar11 = string._M_p + ((long)pcVar3 - (long)pcVar5);
        string._M_p = string._M_p + ((long)pcVar4 - (long)pcVar5);
        local_180._0_8_ = pbVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_180,pcVar11,string._M_p);
        std::__cxx11::string::_M_append((char *)&local_1a0,local_180._0_8_);
        this = (cmStringCommand *)local_128;
      }
      if ((pointer)local_180._0_8_ != pbVar1) {
        operator_delete((void *)local_180._0_8_,(ulong)(local_180._16_8_ + 1));
      }
    } while (pcVar4 != pcVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,
                      CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                               local_1a0.field_2._M_local_buf[0]) + 1);
    }
    uVar2 = local_15c;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    bVar10 = (byte)uVar2 ^ 1;
  }
  else {
    std::operator+(&local_1a0,"sub-command REGEX, mode MATCHALL failed to compile regex \"",__rhs);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_158.field_2._M_allocated_capacity = *psVar9;
      local_158.field_2._8_8_ = plVar7[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar9;
      local_158._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_158._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,
                      CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                               local_1a0.field_2._M_local_buf[0]) + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    bVar10 = 0;
  }
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  return (bool)bVar10;
}

Assistant:

bool cmStringCommand::RegexMatchAll(std::vector<std::string> const& args)
{
  //"STRING(REGEX MATCHALL <regular_expression> <output variable> <input>
  // [<input>...])\n";
  std::string const& regex = args[2];
  std::string const& outvar = args[3];

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if (!re.compile(regex.c_str())) {
    std::string e =
      "sub-command REGEX, mode MATCHALL failed to compile regex \"" + regex +
      "\".";
    this->SetError(e);
    return false;
  }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(4), std::string());

  // Scan through the input for all matches.
  std::string output;
  const char* p = input.c_str();
  while (re.find(p)) {
    this->Makefile->ClearMatches();
    this->Makefile->StoreMatches(re);
    std::string::size_type l = re.start();
    std::string::size_type r = re.end();
    if (r - l == 0) {
      std::string e = "sub-command REGEX, mode MATCHALL regex \"" + regex +
        "\" matched an empty string.";
      this->SetError(e);
      return false;
    }
    if (!output.empty()) {
      output += ";";
    }
    output += std::string(p + l, r - l);
    p += r;
  }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}